

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::check_crfile
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  char cVar1;
  pointer pCVar2;
  pointer pcVar3;
  char *pcVar4;
  pointer p_Var5;
  pointer p_Var6;
  char *pcVar7;
  size_t sVar8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var9;
  byte bVar10;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var11;
  bool *pbVar12;
  char *pcVar13;
  pointer p_Var14;
  CharCount CVar15;
  pointer p_Var16;
  ulong uVar17;
  char *pcVar18;
  
  sVar8 = path_distance<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  this->crfile_path_distance_ = sVar8;
  bVar10 = sVar8 != 0 | this->match_crfile_;
  if (bVar10 == 1) {
    _Var9._M_current =
         (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    _Var11._M_current =
         (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((_Var9._M_current != _Var11._M_current) && (_Var11._M_current[-1] == '/')) {
      _Var11._M_current = _Var11._M_current + -1;
    }
    _Var9 = path_basename<cpsm::PlatformPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                      (_Var9,_Var11);
    (this->item_basename_)._M_current = _Var9._M_current;
    pCVar2 = (this->props_).
             super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (_Var9._M_current != pcVar4) {
      pbVar12 = &pCVar2[(long)_Var9._M_current - (long)pcVar3].alphanumeric;
      _Var11 = _Var9;
      do {
        cVar1 = *_Var11._M_current;
        *pbVar12 = (byte)(cVar1 + 0xbfU) < 0x1a ||
                   ((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10);
        _Var11._M_current = _Var11._M_current + 1;
        pbVar12 = pbVar12 + 3;
      } while (_Var11._M_current != pcVar4);
    }
    p_Var5 = (this->crfile_basename_word_ends_).
             super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var6 = (this->crfile_basename_word_ends_).
             super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var5 == p_Var6) {
      CVar15 = 0;
    }
    else {
      pcVar7 = (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar13 = (this->crfile_basename_)._M_current;
      p_Var14 = p_Var5;
      if (pcVar7 != pcVar13 && pcVar4 != _Var9._M_current) {
        pbVar12 = &pCVar2[(long)(_Var9._M_current + (1 - (long)pcVar3))].alphanumeric;
        pcVar18 = _Var9._M_current + 1;
        uVar17 = (long)pcVar18 - (long)pcVar3;
        p_Var16 = p_Var5;
        while (p_Var14 = p_Var16, pcVar18[-1] == *pcVar13) {
          if ((pcVar13 == p_Var16->_M_current) && (p_Var14 = p_Var16 + 1, p_Var16 + 1 == p_Var6)) {
            p_Var14 = p_Var6;
            if ((uVar17 < (ulong)((long)pcVar4 - (long)pcVar3)) &&
               ((((CharProperties *)(pbVar12 + -1))->uppercase == false && (*pbVar12 != false)))) {
              p_Var14 = p_Var16;
            }
            break;
          }
          if (pcVar18 == pcVar4) break;
          pcVar13 = pcVar13 + 1;
          pbVar12 = pbVar12 + 3;
          uVar17 = uVar17 + 1;
          pcVar18 = pcVar18 + 1;
          p_Var16 = p_Var14;
          if (pcVar13 == pcVar7) break;
        }
      }
      CVar15 = (long)p_Var14 - (long)p_Var5 >> 3;
    }
    this->crfile_basename_shared_words_ = CVar15;
    this->unmatched_suffix_len_ = (long)pcVar4 - (long)_Var9._M_current;
  }
  return (bool)bVar10;
}

Assistant:

bool check_crfile() {
    crfile_path_distance_ = path_distance<PathTraits>(
        item_.cbegin(), item_.cend(), crfile_.cbegin(), crfile_.cend());
    if (!match_crfile_ && crfile_path_distance_ == 0) {
      return false;
    }
    // If the last character in the item is a path separator, skip it for the
    // purposes of determining the item basename to be consistent with
    // `consume_path_component_match_front`.
    if (!item_.empty() && PathTraits::is_path_separator(item_.back())) {
      item_basename_ =
          path_basename<PathTraits>(item_.cbegin(), item_.cend() - 1);
    } else {
      item_basename_ = path_basename<PathTraits>(item_.cbegin(), item_.cend());
    }
    auto props_it = props_.begin() + (item_basename_ - item_.cbegin());
    for (auto item_it = item_basename_, item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->alphanumeric = StringTraits::is_alphanumeric(*item_it);
    }
    crfile_basename_shared_words_ = [this]() -> CharCount {
      auto crfile_word_end_it = crfile_basename_word_ends_.cbegin();
      auto const crfile_word_end_last = crfile_basename_word_ends_.cend();
      if (crfile_word_end_it == crfile_word_end_last) {
        return 0;
      }
      for (auto item_it = item_basename_, item_last = item_.cend(),
                crfile_it = crfile_basename_, crfile_last = crfile_.cend();
           item_it != item_last && crfile_it != crfile_last &&
               *item_it == *crfile_it;
           ++item_it, ++crfile_it) {
        if (crfile_it == *crfile_word_end_it) {
          ++crfile_word_end_it;
          if (crfile_word_end_it == crfile_word_end_last) {
            // Only counts if the next character is plausibly not the
            // continuation of a word.
            std::size_t const i = item_it - item_.cbegin();
            if ((i + 1 < item_.size()) && !props_[i + 1].uppercase &&
                props_[i + 1].alphanumeric) {
              --crfile_word_end_it;
            }
            break;
          }
        }
      }
      return crfile_word_end_it - crfile_basename_word_ends_.cbegin();
    }();
    // Ensure that `unmatched_suffix_len_` is initialized even for empty
    // queries.
    unmatched_suffix_len_ = item_.cend() - item_basename_;
    return true;
  }